

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INetwork.cpp
# Opt level: O3

Score __thiscall
INetwork::ScoreModel(INetwork *this,Dataset *data,LossFunction lossFunction,bool onTest,Time time)

{
  ulong uVar1;
  undefined3 in_register_00000009;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Score SVar6;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  predictions;
  allocator_type local_59;
  LossFunction local_58;
  vector<float,_std::allocator<float>_> *local_50;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_48;
  
  local_50 = &data->yTrain;
  lVar3 = 0;
  if (CONCAT31(in_register_00000009,onTest) != 0) {
    local_50 = &data->yTest;
    lVar3 = 0x30;
  }
  local_58 = lossFunction;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&local_48,
           (*(long *)((long)&(data->xTrain).
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + lVar3) -
            *(long *)((long)&(data->xTrain).
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3) >> 3) *
           -0x5555555555555555,&local_59);
  lVar4 = *(long *)((long)&(data->xTrain).
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar3);
  if (*(long *)((long)&(data->xTrain).
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + lVar3) != lVar4) {
    lVar5 = 0;
    uVar2 = 0;
    do {
      (*this->_vptr_INetwork[4])
                (time,this,lVar4 + lVar5,
                 (long)&((local_48.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar5);
      uVar2 = uVar2 + 1;
      lVar4 = *(long *)((long)&(data->xTrain).
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar3);
      uVar1 = (*(long *)((long)&(data->xTrain).
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + lVar3) - lVar4 >> 3) *
              -0x5555555555555555;
      lVar5 = lVar5 + 0x18;
    } while (uVar2 <= uVar1 && uVar1 - uVar2 != 0);
  }
  SVar6 = (*local_58)(&local_48,local_50);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_48);
  return SVar6;
}

Assistant:

SPIKING_NN::Score INetwork::ScoreModel( SPIKING_NN::Dataset &data, SPIKING_NN::LossFunction lossFunction, bool onTest,
                                        SPIKING_NN::Time time )
{
    std::vector<SPIKING_NN::Sample> &samples = ( onTest ? data.xTest : data.xTrain );
    std::vector<SPIKING_NN::Target> &labels = ( onTest ? data.yTest : data.yTrain );
    std::vector<SPIKING_NN::Output> predictions( samples.size());
    for ( int sampleId = 0; sampleId < samples.size(); ++sampleId ) {
        Forward( samples[sampleId], predictions[sampleId], time );
    }
    return lossFunction( predictions, labels );
}